

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O2

SUNErrCode SUNMatCopy_Dense(SUNMatrix A,SUNMatrix B)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  plVar1 = (long *)A->content;
  lVar2 = plVar1[1];
  if (plVar1[1] < 1) {
    lVar2 = 0;
  }
  for (lVar3 = 0; lVar3 != lVar2; lVar3 = lVar3 + 1) {
    lVar4 = *plVar1;
    if (*plVar1 < 1) {
      lVar4 = 0;
    }
    for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
      *(undefined8 *)(*(long *)(*(long *)((long)B->content + 0x20) + lVar3 * 8) + lVar5 * 8) =
           *(undefined8 *)(*(long *)(plVar1[4] + lVar3 * 8) + lVar5 * 8);
    }
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatCopy_Dense(SUNMatrix A, SUNMatrix B)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j;

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);
  SUNAssert(SUNMatGetID(B) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrices(A, B), SUN_ERR_ARG_DIMSMISMATCH);

  /* Perform operation B_ij = A_ij */
  for (j = 0; j < SM_COLUMNS_D(A); j++)
  {
    for (i = 0; i < SM_ROWS_D(A); i++)
    {
      SM_ELEMENT_D(B, i, j) = SM_ELEMENT_D(A, i, j);
    }
  }

  return SUN_SUCCESS;
}